

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float sum_1;
  int remain_1;
  float sum2;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr2;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  float local_324;
  int local_304;
  int local_2f8;
  int local_2f4;
  float *local_2d8;
  float *local_2d0;
  float *local_2c8;
  float *local_2c0;
  float *local_268;
  float *local_250;
  int local_1ec;
  
  iVar19 = *(int *)((long)in_RDI + 0x2c);
  iVar20 = *(int *)((long)in_RSI + 0x2c);
  lVar23 = in_RSI[6];
  lVar24 = in_RDI[7];
  lVar21 = *in_RDX;
  lVar22 = *in_RCX;
  for (local_1ec = 0; local_1ec < (int)lVar24; local_1ec = local_1ec + 1) {
    local_250 = (float *)(*in_RSI + in_RSI[8] * (long)local_1ec * in_RSI[2]);
    if (lVar22 == 0) {
      local_324 = 0.0;
    }
    else {
      local_324 = *(float *)(lVar22 + (long)local_1ec * 4);
    }
    pfVar25 = (float *)(lVar21 + (long)(local_1ec * 9) * 4);
    local_268 = local_250 + iVar20;
    local_2c0 = (float *)(*in_RDI + in_RDI[8] * (long)local_1ec * in_RDI[2]);
    local_2c8 = local_2c0 + iVar19;
    local_2d0 = local_2c0 + (iVar19 << 1);
    local_2d8 = local_2c0 + iVar19 * 3;
    pfVar26 = pfVar25 + 3;
    pfVar27 = pfVar25 + 6;
    for (local_2f4 = 0; local_2f8 = iVar20, local_2f4 + 1 < (int)lVar23; local_2f4 = local_2f4 + 2)
    {
      for (; 0 < local_2f8; local_2f8 = local_2f8 + -1) {
        fVar1 = *local_2c8;
        fVar2 = *pfVar25;
        fVar3 = local_2c8[1];
        fVar4 = pfVar25[1];
        fVar5 = local_2c8[2];
        fVar6 = pfVar25[2];
        fVar7 = *local_2d0;
        fVar8 = *pfVar26;
        fVar9 = local_2d0[1];
        fVar10 = pfVar25[4];
        fVar11 = local_2d0[2];
        fVar12 = pfVar25[5];
        fVar13 = *local_2d8;
        fVar14 = *pfVar27;
        fVar15 = local_2d8[1];
        fVar16 = pfVar25[7];
        fVar17 = local_2d8[2];
        fVar18 = pfVar25[8];
        *local_250 = local_2d0[2] * pfVar25[8] +
                     local_2d0[1] * pfVar25[7] +
                     *local_2d0 * *pfVar27 +
                     local_2c8[2] * pfVar25[5] +
                     local_2c8[1] * pfVar25[4] +
                     *local_2c8 * *pfVar26 +
                     local_2c0[2] * pfVar25[2] +
                     local_2c0[1] * pfVar25[1] + *local_2c0 * *pfVar25 + local_324;
        *local_268 = fVar17 * fVar18 +
                     fVar15 * fVar16 +
                     fVar13 * fVar14 +
                     fVar11 * fVar12 +
                     fVar9 * fVar10 +
                     fVar7 * fVar8 + fVar5 * fVar6 + fVar3 * fVar4 + fVar1 * fVar2 + local_324;
        local_2c0 = local_2c0 + 1;
        local_2c8 = local_2c8 + 1;
        local_2d0 = local_2d0 + 1;
        local_2d8 = local_2d8 + 1;
        local_250 = local_250 + 1;
        local_268 = local_268 + 1;
      }
      local_2c0 = local_2c0 + (iVar19 + 2);
      local_2c8 = local_2c8 + (iVar19 + 2);
      local_2d0 = local_2d0 + (iVar19 + 2);
      local_2d8 = local_2d8 + (iVar19 + 2);
      local_250 = local_250 + iVar20;
      local_268 = local_268 + iVar20;
    }
    for (; local_304 = iVar20, local_2f4 < (int)lVar23; local_2f4 = local_2f4 + 1) {
      for (; 0 < local_304; local_304 = local_304 + -1) {
        *local_250 = local_2d0[2] * pfVar25[8] +
                     local_2d0[1] * pfVar25[7] +
                     *local_2d0 * *pfVar27 +
                     local_2c8[2] * pfVar25[5] +
                     local_2c8[1] * pfVar25[4] +
                     *local_2c8 * *pfVar26 +
                     local_2c0[2] * pfVar25[2] +
                     local_2c0[1] * pfVar25[1] + *local_2c0 * *pfVar25 + local_324;
        local_2c0 = local_2c0 + 1;
        local_2c8 = local_2c8 + 1;
        local_2d0 = local_2d0 + 1;
        local_250 = local_250 + 1;
      }
      local_2c0 = local_2c0 + 2;
      local_2c8 = local_2c8 + 2;
      local_2d0 = local_2d0 + 2;
    }
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;
        const float* r3 = img0 + w * 3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i + 1 < outh; i += 2)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}